

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O2

void __thiscall
tf::SmallVectorBase::grow_pod
          (SmallVectorBase *this,void *FirstEl,size_t MinSizeInBytes,size_t TSize)

{
  ulong uVar1;
  void *__src;
  void *__dest;
  size_t __n;
  
  __src = this->BeginX;
  __n = (long)this->EndX - (long)__src;
  uVar1 = TSize + ((long)this->CapacityX - (long)__src) * 2;
  if (MinSizeInBytes < uVar1) {
    MinSizeInBytes = uVar1;
  }
  if (__src == FirstEl) {
    __dest = malloc(MinSizeInBytes);
    memcpy(__dest,__src,__n);
  }
  else {
    __dest = realloc(__src,MinSizeInBytes);
  }
  this->EndX = (void *)(__n + (long)__dest);
  this->BeginX = __dest;
  this->CapacityX = (void *)(MinSizeInBytes + (long)__dest);
  return;
}

Assistant:

void grow_pod(void *FirstEl, size_t MinSizeInBytes, size_t TSize){
    size_t CurSizeBytes = size_in_bytes();
    size_t NewCapacityInBytes = 2 * capacity_in_bytes() + TSize; // Always grow.
    if (NewCapacityInBytes < MinSizeInBytes) {
      NewCapacityInBytes = MinSizeInBytes;
    }

    void *NewElts;
    if (BeginX == FirstEl) {
      NewElts = std::malloc(NewCapacityInBytes);

      // Copy the elements over.  No need to run dtors on PODs.
      memcpy(NewElts, this->BeginX, CurSizeBytes);
    } else {
      // If this wasn't grown from the inline copy, grow the allocated space.
      NewElts = realloc(this->BeginX, NewCapacityInBytes);
    }
    //assert(NewElts && "Out of memory");

    this->EndX = (char*)NewElts+CurSizeBytes;
    this->BeginX = NewElts;
    this->CapacityX = (char*)this->BeginX + NewCapacityInBytes;
  }